

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalNotOperator(Evaluator *this,GCPtr<symbols::Object> *rightExpr)

{
  Object *pOVar1;
  Object *pOVar2;
  GCPtr<symbols::Object> *rightExpr_local;
  
  pOVar1 = GCPtr::operator_cast_to_Object_((GCPtr *)rightExpr);
  pOVar2 = GCPtr::operator_cast_to_Object_((GCPtr *)&NATIVE_TRUE);
  if (pOVar1 == pOVar2) {
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_FALSE);
  }
  else {
    pOVar1 = GCPtr::operator_cast_to_Object_((GCPtr *)rightExpr);
    pOVar2 = GCPtr::operator_cast_to_Object_((GCPtr *)&NATIVE_FALSE);
    if (pOVar1 == pOVar2) {
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_TRUE);
    }
    else {
      pOVar1 = GCPtr::operator_cast_to_Object_((GCPtr *)rightExpr);
      pOVar2 = GCPtr::operator_cast_to_Object_((GCPtr *)&NATIVE_NULL);
      if (pOVar1 == pOVar2) {
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
      }
      else {
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_FALSE);
      }
    }
  }
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalNotOperator(GCPtr<Object> rightExpr){
    if(rightExpr == NATIVE_TRUE){
        return NATIVE_FALSE;
    }else if(rightExpr == NATIVE_FALSE){
        return NATIVE_TRUE;
    }else if(rightExpr == NATIVE_NULL){
       return NATIVE_NULL;
    }
    return NATIVE_FALSE;
}